

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,qsizetype pos,qsizetype len,QByteArrayView after)

{
  char *pcVar1;
  long lVar2;
  QByteArray *pQVar3;
  size_t __n;
  char *first;
  long in_FS_OFFSET;
  QVarLengthArray<char,_256LL> copy;
  undefined1 local_150 [280];
  long local_38;
  
  first = after.m_data;
  __n = after.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->d).ptr;
  lVar2 = (this->d).size;
  if (first < pcVar1 + lVar2 && pcVar1 <= first) {
    memset((QVarLengthArray<char,_256LL> *)local_150,0xaa,0x118);
    QVarLengthArray<char,_256LL>::QVarLengthArray<const_char_*,_true>
              ((QVarLengthArray<char,_256LL> *)local_150,first,first + __n);
    this = replace(this,pos,len,(QByteArrayView)local_150._8_16_);
    QVarLengthArray<char,_256LL>::~QVarLengthArray((QVarLengthArray<char,_256LL> *)local_150);
  }
  else {
    if ((__n != len) || (lVar2 < (long)(__n + pos))) {
      remove(this,(char *)pos);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pQVar3 = insert(this,pos,after);
        return pQVar3;
      }
      goto LAB_002d1ce3;
    }
    if (0 < (long)__n) {
      detach(this);
      memcpy((this->d).ptr + pos,first,__n);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_002d1ce3:
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::replace(qsizetype pos, qsizetype len, QByteArrayView after)
{
    if (QtPrivate::q_points_into_range(after.data(), d)) {
        QVarLengthArray copy(after.data(), after.data() + after.size());
        return replace(pos, len, QByteArrayView{copy});
    }
    if (len == after.size() && (pos + len <= size())) {
        // same size: in-place replacement possible
        if (len > 0) {
            detach();
            memcpy(d.data() + pos, after.data(), len*sizeof(char));
        }
        return *this;
    } else {
        // ### optimize me
        remove(pos, len);
        return insert(pos, after);
    }
}